

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O2

void __thiscall
FileTarget::FileTarget(FileTarget *this,string *aSource,string *aTarget,PackFormat pf,uint64_t offs)

{
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&this->source,aSource)
  ;
  std::__cxx11::string::string((string *)&this->target,(string *)aTarget);
  this->size = 0;
  this->packFormat = pf;
  this->offset = offs;
  return;
}

Assistant:

FileTarget(const std::string& aSource = "", const std::string& aTarget = "",
               PackFormat pf = INTEL_COMPRESSED, uint64_t offs = 0xffffffff)
        : source(aSource), target(aTarget), packFormat(pf), offset(offs)
    {}